

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

String * __thiscall
kj::PathPtr::toWin32StringImpl
          (String *__return_storage_ptr__,PathPtr *this,bool absolute,bool forApi)

{
  byte bVar1;
  String *pSVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  undefined7 in_register_00000011;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar8;
  ulong uVar9;
  size_t extraout_RDX_01;
  size_t i;
  long lVar10;
  size_t sVar11;
  long lVar12;
  Path *pPVar13;
  Path *pPVar14;
  char cVar15;
  String *params_1;
  char *pcVar16;
  ArrayPtr<const_char> part;
  StringPtr part_00;
  byte local_5c;
  Fault f;
  Fault f_2;
  
  part.size_ = (char (*) [2])CONCAT71(in_register_00000011,absolute);
  sVar8 = (this->parts).size_;
  if (sVar8 == 0) {
    if (absolute) {
      toWin32StringImpl();
      return __return_storage_ptr__;
    }
    str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x3af86a,part.size_);
    return __return_storage_ptr__;
  }
  pSVar2 = (this->parts).ptr;
  if (absolute) {
    pPVar14 = (Path *)(pSVar2->content).size_;
    pPVar13 = pPVar14;
    if (pPVar14 != (Path *)0x0) {
      pPVar13 = (Path *)(pSVar2->content).ptr;
    }
    pcVar16 = (char *)0x0;
    if (pPVar14 != (Path *)0x0) {
      pcVar16 = (char *)((long)&pPVar14[-1].parts.disposer + 7);
    }
    if ((pcVar16 == (char *)0x2) && (*(char *)((long)&(pPVar13->parts).ptr + 1) == ':')) {
      bVar1 = *(byte *)&(pPVar13->parts).ptr;
      if ('`' < (char)bVar1) {
        if (bVar1 < 0x7b) {
          uVar6 = (ulong)forApi << 2;
          local_5c = forApi;
          goto LAB_00342afd;
        }
        goto LAB_00342b0f;
      }
      if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_00342b0f;
      lVar7 = 0;
    }
    else {
LAB_00342b0f:
      part.ptr = pcVar16;
      bVar3 = Path::isNetbiosName(pPVar13,part);
      lVar7 = 1;
      if (!bVar3) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70],kj::String_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xd2,FAILED,(char *)0x0,
                   "\"absolute win32 path must start with drive letter or netbios host name\", parts[0]"
                   ,(char (*) [70])
                    "absolute win32 path must start with drive letter or netbios host name",pSVar2);
        _::Debug::Fault::fatal(&f);
      }
    }
    cVar15 = (char)lVar7;
    if (forApi) {
      uVar6 = lVar7 * 4 + 4;
      local_5c = 1;
    }
    else {
      uVar6 = (ulong)(uint)((int)lVar7 * 2);
      local_5c = 0;
    }
  }
  else {
    uVar6 = 0;
    local_5c = 0;
LAB_00342afd:
    cVar15 = '\0';
  }
  sVar11 = (sVar8 + uVar6) - 1;
  lVar7 = 0;
  do {
    lVar10 = *(long *)((long)&(pSVar2->content).size_ + lVar7);
    lVar12 = 0;
    if (lVar10 != 0) {
      lVar12 = lVar10 + -1;
    }
    sVar11 = sVar11 + lVar12;
    lVar7 = lVar7 + 0x18;
  } while (sVar8 * 0x18 != lVar7);
  heapString(__return_storage_ptr__,sVar11);
  pcVar16 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (__return_storage_ptr__->content).ptr;
  }
  if (local_5c == 0) {
    if (cVar15 == '\0') goto LAB_00342bd0;
    pcVar4 = pcVar16 + 1;
    *pcVar16 = '\\';
    lVar7 = 2;
  }
  else {
    builtin_strncpy(pcVar16,"\\\\?\\",4);
    if (cVar15 == '\0') {
      pcVar16 = pcVar16 + 4;
      goto LAB_00342bd0;
    }
    pcVar16[4] = 'U';
    pcVar16[5] = 'N';
    pcVar4 = pcVar16 + 7;
    pcVar16[6] = 'C';
    lVar7 = 8;
  }
  pcVar16 = pcVar16 + lVar7;
  *pcVar4 = '\\';
LAB_00342bd0:
  sVar8 = (this->parts).size_;
  if (sVar8 != 0) {
    params_1 = (this->parts).ptr;
    pSVar2 = params_1 + sVar8;
    bVar3 = false;
    sVar8 = extraout_RDX;
    do {
      if (bVar3) {
        *pcVar16 = '\\';
        pcVar16 = pcVar16 + 1;
      }
      pPVar14 = (Path *)(params_1->content).ptr;
      sVar11 = (params_1->content).size_;
      pPVar13 = pPVar14;
      if (sVar11 == 0) {
        pPVar13 = (Path *)0x36d124;
      }
      part_00.content.ptr = (char *)(sVar11 + (sVar11 == 0));
      part_00.content.size_ = sVar8;
      bVar3 = Path::isWin32Special(pPVar13,part_00);
      if (bVar3) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38],kj::String_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xf9,FAILED,"!Path::isWin32Special(p)",
                   "\"path cannot contain DOS reserved name\", p",
                   (char (*) [38])"path cannot contain DOS reserved name",params_1);
        if (1 < (params_1->content).size_) {
          uVar6 = 0;
          do {
            pcVar16[uVar6] = '|';
            uVar6 = uVar6 + 1;
            sVar8 = (params_1->content).size_;
            uVar9 = 0;
            if (sVar8 != 0) {
              uVar9 = sVar8 - 1;
            }
          } while (uVar6 < uVar9);
          pcVar16 = pcVar16 + uVar6;
        }
        _::Debug::Fault::~Fault(&f);
        sVar8 = extraout_RDX_01;
      }
      else {
        if (sVar11 == 0) {
          pPVar14 = (Path *)0x0;
        }
        sVar5 = sVar11 - 1;
        if (sVar11 == 0) {
          sVar5 = 0;
        }
        memcpy(pcVar16,pPVar14,sVar5);
        sVar8 = (params_1->content).size_;
        sVar5 = sVar8 - 1;
        if (sVar8 == 0) {
          sVar5 = 0;
        }
        pcVar16 = pcVar16 + sVar5;
        sVar8 = extraout_RDX_00;
      }
      params_1 = params_1 + 1;
      bVar3 = true;
    } while (params_1 != pSVar2);
  }
  sVar8 = (__return_storage_ptr__->content).size_;
  pcVar4 = (__return_storage_ptr__->content).ptr + (sVar8 - 1);
  if (sVar8 == 0) {
    pcVar4 = (char *)0x0;
  }
  if (pcVar16 == pcVar4) {
    lVar7 = 0;
    if (sVar8 != 0) {
      lVar7 = sVar8 - 1;
    }
    if (sVar8 != 0 && sVar8 - 1 != 0) {
      lVar10 = 0;
      do {
        if (((__return_storage_ptr__->content).ptr[lVar10] == ':') &&
           ((ulong)local_5c * 4 + 1 != lVar10 || !absolute)) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80],kj::String&>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x113,FAILED,(char *)0x0,
                     "\"colons are prohibited in win32 paths to avoid triggering alterante data streams\", result"
                     ,(char (*) [80])
                      "colons are prohibited in win32 paths to avoid triggering alterante data streams"
                     ,__return_storage_ptr__);
          (__return_storage_ptr__->content).ptr[lVar10] = '|';
          _::Debug::Fault::~Fault(&f);
        }
        lVar10 = lVar10 + 1;
      } while (lVar7 != lVar10);
    }
    return __return_storage_ptr__;
  }
  f_2.exception = (Exception *)0x0;
  f.exception = (Exception *)0x0;
  _::Debug::Fault::init
            (&f_2,(EVP_PKEY_CTX *)
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
            );
  _::Debug::Fault::fatal(&f_2);
}

Assistant:

String PathPtr::toWin32StringImpl(bool absolute, bool forApi) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    KJ_REQUIRE(!absolute, "absolute path is missing disk designator") {
      break;
    }
    return absolute ? kj::str("\\\\") : kj::str(".");
  }

  bool isUncPath = false;
  if (absolute) {
    if (Path::isWin32Drive(parts[0])) {
      // It's a win32 drive
    } else if (Path::isNetbiosName(parts[0])) {
      isUncPath = true;
    } else {
      KJ_FAIL_REQUIRE("absolute win32 path must start with drive letter or netbios host name",
                      parts[0]);
    }
  } else {
    // Currently we do nothing differently in the forApi case for relative paths.
    forApi = false;
  }

  size_t size = forApi
      ? (isUncPath ? 8 : 4) + (parts.size() - 1)
      : (isUncPath ? 2 : 0) + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = heapString(size);

  char* ptr = result.begin();

  if (forApi) {
    *ptr++ = '\\';
    *ptr++ = '\\';
    *ptr++ = '?';
    *ptr++ = '\\';
    if (isUncPath) {
      *ptr++ = 'U';
      *ptr++ = 'N';
      *ptr++ = 'C';
      *ptr++ = '\\';
    }
  } else {
    if (isUncPath) {
      *ptr++ = '\\';
      *ptr++ = '\\';
    }
  }

  bool leadingSlash = false;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '\\';
    leadingSlash = true;

    KJ_REQUIRE(!Path::isWin32Special(p), "path cannot contain DOS reserved name", p) {
      // Recover by blotting out the name with invalid characters which Win32 syscalls will reject.
      for (size_t i = 0; i < p.size(); i++) {
        *ptr++ = '|';
      }
      goto skip;
    }

    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  skip:;
  }

  KJ_ASSERT(ptr == result.end());

  // Check for colons (other than in drive letter), which on NTFS would be interpreted as an
  // "alternate data stream", which can lead to surprising results. If we want to support ADS, we
  // should do so using an explicit API. Note that this check also prevents a relative path from
  // appearing to start with a drive letter.
  for (size_t i: kj::indices(result)) {
    if (result[i] == ':') {
      if (absolute && i == (forApi ? 5 : 1)) {
        // False alarm: this is the drive letter.
      } else {
        KJ_FAIL_REQUIRE(
            "colons are prohibited in win32 paths to avoid triggering alterante data streams",
            result) {
          // Recover by using a different character which we know Win32 syscalls will reject.
          result[i] = '|';
          break;
        }
      }
    }
  }

  return result;
}